

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldAccessorDefinitions
          (MessageGenerator *this,Printer *printer,bool is_inline)

{
  MessageGenerator *field;
  string *__k;
  key_type *__k_00;
  long lVar1;
  bool bVar2;
  mapped_type *pmVar3;
  FieldGenerator *pFVar4;
  undefined7 in_register_00000011;
  Descriptor *descriptor;
  long lVar5;
  MessageGenerator *field_00;
  size_type sVar6;
  MessageGenerator *this_00;
  allocator<char> local_131;
  Printer *local_130;
  MessageGenerator *local_128;
  uint local_11c;
  long local_118;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  undefined1 local_e0 [64];
  key_type local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_130 = printer;
  io::Printer::Print(printer,"// $classname$\n\n","classname",&this->classname_);
  local_e0._48_8_ = &this->options_;
  local_e0._40_8_ = "inline ";
  if ((int)CONCAT71(in_register_00000011,is_inline) == 0) {
    local_e0._40_8_ = "";
  }
  local_e0._32_8_ = &this->field_generators_;
  __k = (string *)(local_e0 + 0x60);
  local_11c = (uint)is_inline;
  lVar5 = 0;
  sVar6 = 0;
  local_128 = this;
  do {
    if ((long)*(int *)(local_128->descriptor_ + 0x2c) <= (long)sVar6) {
      if (local_128->use_dependent_base_ == false) {
        GenerateOneofHasBits(local_128,local_130,SUB41(local_11c,0));
      }
      return;
    }
    lVar1 = *(long *)(local_128->descriptor_ + 0x30);
    field = (MessageGenerator *)(lVar1 + lVar5);
    local_118 = lVar5;
    local_e0._56_8_ = sVar6;
    anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>
              (local_130,(FieldDescriptor *)field);
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vars._M_t._M_impl.super__Rb_tree_header._M_header;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    SetCommonFieldVariables((FieldDescriptor *)field,&vars,(Options *)local_e0._48_8_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_e0,"inline",(allocator<char> *)__k);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)local_e0);
    std::__cxx11::string::assign((char *)pmVar3);
    std::__cxx11::string::~string((string *)local_e0);
    if (local_128->use_dependent_base_ == true) {
      bVar2 = IsFieldDependent((FieldDescriptor *)field);
      if (!bVar2) goto LAB_00278b13;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e0,"tmpl",(allocator<char> *)__k);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)local_e0);
      std::__cxx11::string::assign((char *)pmVar3);
      std::__cxx11::string::~string((string *)local_e0);
      DependentBaseClassTemplateName_abi_cxx11_(__k,(cpp *)local_128->descriptor_,descriptor);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     __k,"<T>");
      __k_00 = (key_type *)(local_e0 + 0x40);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__k_00,"dependent_classname",&local_131);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,__k_00);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)local_e0);
      std::__cxx11::string::~string((string *)__k_00);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)__k);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e0,"this_message",(allocator<char> *)__k);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)local_e0);
      std::__cxx11::string::assign((char *)pmVar3);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e0,"this_const_message",(allocator<char> *)__k);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)local_e0);
      std::__cxx11::string::assign((char *)pmVar3);
    }
    else {
LAB_00278b13:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e0,"tmpl",(allocator<char> *)__k);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)local_e0);
      std::__cxx11::string::assign((char *)pmVar3);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e0,"classname",(allocator<char> *)(local_e0 + 0x40));
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&vars,(key_type *)local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__k,"dependent_classname",&local_131);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,__k);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      std::__cxx11::string::~string((string *)__k);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e0,"this_message",(allocator<char> *)__k);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)local_e0);
      std::__cxx11::string::assign((char *)pmVar3);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e0,"this_const_message",(allocator<char> *)__k);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)local_e0);
      std::__cxx11::string::assign((char *)pmVar3);
    }
    std::__cxx11::string::~string((string *)local_e0);
    if (*(int *)(lVar1 + 0x4c + local_118) == 3) {
      io::Printer::Print(local_130,&vars,
                         "$inline$int $classname$::$name$_size() const {\n  return $name$_.size();\n}\n"
                        );
    }
    else if (*(long *)(lVar1 + 0x60 + local_118) == 0) {
      if (local_128->use_dependent_base_ == true) {
        bVar2 = IsFieldDependent((FieldDescriptor *)field);
        if (bVar2) goto LAB_00278dc1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_e0 + 0x80),&vars._M_t);
      GenerateSingularFieldHasBits
                (local_128,(FieldDescriptor *)field,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_e0 + 0x80),local_130);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_e0 + 0x80));
    }
    else {
      UnderscoresToCamelCase((string *)local_e0,(string *)field->descriptor_,true);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__k,"field_name",(allocator<char> *)(local_e0 + 0x40));
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,__k);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)local_e0);
      std::__cxx11::string::~string((string *)__k);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e0,"oneof_name",(allocator<char> *)__k);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)local_e0);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      std::__cxx11::string::~string((string *)local_e0);
      lVar5 = *(long *)(lVar1 + 0x60 + local_118);
      lVar5 = lVar5 - *(long *)(*(long *)(lVar5 + 0x10) + 0x40);
      SimpleItoa_abi_cxx11_
                ((string *)local_e0,(protobuf *)(lVar5 / 0x30 & 0xffffffff),(int)(lVar5 % 0x30));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__k,"oneof_index",(allocator<char> *)(local_e0 + 0x40));
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,__k);
      field_00 = (MessageGenerator *)local_e0;
      std::__cxx11::string::operator=((string *)pmVar3,(string *)local_e0);
      std::__cxx11::string::~string((string *)__k);
      this_00 = (MessageGenerator *)local_e0;
      std::__cxx11::string::~string((string *)local_e0);
      if (local_128->use_dependent_base_ == true) {
        this_00 = field;
        bVar2 = IsFieldDependent((FieldDescriptor *)field);
        if (bVar2) goto LAB_00278dc1;
      }
      GenerateOneofMemberHasBits(this_00,(FieldDescriptor *)field_00,&vars,local_130);
    }
LAB_00278dc1:
    if (local_128->use_dependent_base_ == true) {
      bVar2 = IsFieldDependent((FieldDescriptor *)field);
      if (!bVar2) goto LAB_00278ddb;
    }
    else {
LAB_00278ddb:
      GenerateFieldClear(local_128,(FieldDescriptor *)field,&vars,local_130);
    }
    pFVar4 = FieldGeneratorMap::get((FieldGeneratorMap *)local_e0._32_8_,(FieldDescriptor *)field);
    (*pFVar4->_vptr_FieldGenerator[7])(pFVar4,local_130,(ulong)local_11c);
    io::Printer::Print(local_130,"\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&vars._M_t);
    sVar6 = local_e0._56_8_ + 1;
    lVar5 = local_118 + 0xa8;
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateFieldAccessorDefinitions(io::Printer* printer, bool is_inline) {
  printer->Print("// $classname$\n\n", "classname", classname_);

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    PrintFieldComment(printer, field);

    std::map<string, string> vars;
    SetCommonFieldVariables(field, &vars, options_);
    vars["inline"] = is_inline ? "inline " : "";
    if (use_dependent_base_ && IsFieldDependent(field)) {
      vars["tmpl"] = "template<class T>\n";
      vars["dependent_classname"] =
          DependentBaseClassTemplateName(descriptor_) + "<T>";
      vars["this_message"] = "reinterpret_cast<T*>(this)->";
      vars["this_const_message"] = "reinterpret_cast<const T*>(this)->";
    } else {
      vars["tmpl"] = "";
      vars["dependent_classname"] = vars["classname"];
      vars["this_message"] = "";
      vars["this_const_message"] = "";
    }

    // Generate has_$name$() or $name$_size().
    if (field->is_repeated()) {
      printer->Print(vars,
        "$inline$"
        "int $classname$::$name$_size() const {\n"
        "  return $name$_.size();\n"
        "}\n");
    } else if (field->containing_oneof()) {
      vars["field_name"] = UnderscoresToCamelCase(field->name(), true);
      vars["oneof_name"] = field->containing_oneof()->name();
      vars["oneof_index"] = SimpleItoa(field->containing_oneof()->index());
      if (!use_dependent_base_ || !IsFieldDependent(field)) {
        GenerateOneofMemberHasBits(field, vars, printer);
      }
    } else {
      // Singular field.
      if (!use_dependent_base_ || !IsFieldDependent(field)) {
        GenerateSingularFieldHasBits(field, vars, printer);
      }
    }

    if (!use_dependent_base_ || !IsFieldDependent(field)) {
      GenerateFieldClear(field, vars, printer);
    }

    // Generate type-specific accessors.
    field_generators_.get(field).GenerateInlineAccessorDefinitions(printer,
                                                                   is_inline);

    printer->Print("\n");
  }

  if (!use_dependent_base_) {
    // Generate has_$name$() and clear_has_$name$() functions for oneofs
    // If we aren't using a dependent base, they can be with the other functions
    // that are #ifdef-guarded.
    GenerateOneofHasBits(printer, is_inline);
  }
}